

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O1

vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
* detail::operator|(vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                    *__return_storage_ptr__,b_str<char32_t> *str,
                   split_helper<char32_t,_true,_false,_false> *info)

{
  pointer pcVar1;
  pointer pbVar2;
  char32_t *pcVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  size_type __n;
  ulong local_40;
  unsigned_long local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = 0;
  do {
    uVar4 = 0xffffffffffffffff;
    lVar5 = str->_M_string_length - local_40;
    if (local_40 <= str->_M_string_length && lVar5 != 0) {
      pcVar1 = (str->_M_dataplus)._M_p;
      pcVar3 = pcVar1 + local_40;
      do {
        if (*pcVar3 == info->delim) goto LAB_001df58a;
        pcVar3 = pcVar3 + 1;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      pcVar3 = (char32_t *)0x0;
LAB_001df58a:
      uVar4 = -(ulong)(pcVar3 == (char32_t *)0x0) | (long)pcVar3 - (long)pcVar1 >> 2;
    }
    if (uVar4 == 0xffffffffffffffff) {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      erase(str,0,local_40);
      std::vector<std::__cxx11::u32string,std::allocator<std::__cxx11::u32string>>::
      emplace_back<std::__cxx11::u32string>
                ((vector<std::__cxx11::u32string,std::allocator<std::__cxx11::u32string>> *)
                 __return_storage_ptr__,str);
      return __return_storage_ptr__;
    }
    pbVar2 = (__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(__return_storage_ptr__->
                  super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
    lVar5 = lVar6 >> 5;
    if ((ulong)((long)(__return_storage_ptr__->
                      super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar2 >> 5) <
        lVar5 + 1U) {
      __n = lVar6 >> 4;
      if (lVar5 < 0) {
        __n = 0xffffffffffffffff;
      }
      std::
      vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
      ::reserve(__return_storage_ptr__,__n);
    }
    local_38 = uVar4 - local_40;
    std::vector<std::__cxx11::u32string,std::allocator<std::__cxx11::u32string>>::
    emplace_back<std::__cxx11::u32string&,unsigned_long&,unsigned_long>
              ((vector<std::__cxx11::u32string,std::allocator<std::__cxx11::u32string>> *)
               __return_storage_ptr__,str,&local_40,&local_38);
    local_40 = uVar4 + 1;
  } while( true );
}

Assistant:

vector<b_str<CharType>> operator| (b_str<CharType>&& str, const split_helper<CharType, true, false, false>& info)
	{
		vector<b_str<CharType>> re;
		size_t current = 0;
		for (size_t found; (found = str.find_first_of(info.delim, current)) != b_str<CharType>::npos; current = found + 1) {
			if (re.capacity() < re.size() + 1) re.reserve((std::numeric_limits<size_t>::max() / 2 < re.size()) ? std::numeric_limits<size_t>::max() : re.size() * 2);
			re.emplace_back(str, current, found - current);
		}
		str.erase(0, current);
		re.emplace_back(std::move(str));
		return re;
	}